

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_core_module.c
# Opt level: O1

ngx_int_t ngx_http_get_forwarded_addr_internal
                    (ngx_http_request_t *r,ngx_addr_t *addr,u_char *xff,size_t xfflen,
                    ngx_array_t *proxies,int recursive)

{
  ngx_int_t nVar1;
  u_char *puVar2;
  u_char *text;
  undefined1 auStack_70 [8];
  ngx_addr_t paddr;
  
  nVar1 = ngx_cidr_match(addr->sockaddr,proxies);
  if (nVar1 != 0) {
    return -5;
  }
  puVar2 = xff + (xfflen - 1);
  text = puVar2;
  if (xff < puVar2) {
    do {
      if ((*puVar2 != ',') && (text = puVar2, *puVar2 != ' ')) goto joined_r0x0013c37b;
      xfflen = xfflen - 1;
      puVar2 = puVar2 + -1;
    } while (xff < puVar2);
    xfflen = 1;
    puVar2 = xff;
    text = xff;
  }
joined_r0x0013c37b:
  do {
    if (puVar2 <= xff) {
LAB_0013c39b:
      paddr.name.data = (u_char *)proxies;
      nVar1 = ngx_parse_addr_port(r->pool,(ngx_addr_t *)auStack_70,text,
                                  (size_t)(xff + (xfflen - (long)text)));
      if (nVar1 != 0) {
        return -5;
      }
      (addr->name).len = paddr._8_8_;
      (addr->name).data = (u_char *)paddr.name.len;
      addr->sockaddr = (sockaddr *)auStack_70;
      *(sockaddr **)&addr->socklen = paddr.sockaddr;
      if (recursive == 0) {
        return 0;
      }
      if (text <= xff) {
        return 0;
      }
      nVar1 = ngx_http_get_forwarded_addr_internal
                        (r,addr,xff,(size_t)(text + ~(ulong)xff),(ngx_array_t *)paddr.name.data,1);
      if (nVar1 == -5) {
        return -4;
      }
      return nVar1;
    }
    if ((*puVar2 == ',') || (*puVar2 == ' ')) {
      text = puVar2 + 1;
      goto LAB_0013c39b;
    }
    puVar2 = puVar2 + -1;
    text = xff;
  } while( true );
}

Assistant:

static ngx_int_t
ngx_http_get_forwarded_addr_internal(ngx_http_request_t *r, ngx_addr_t *addr,
    u_char *xff, size_t xfflen, ngx_array_t *proxies, int recursive)
{
    u_char      *p;
    ngx_int_t    rc;
    ngx_addr_t   paddr;

    if (ngx_cidr_match(addr->sockaddr, proxies) != NGX_OK) {
        return NGX_DECLINED;
    }

    for (p = xff + xfflen - 1; p > xff; p--, xfflen--) {
        if (*p != ' ' && *p != ',') {
            break;
        }
    }

    for ( /* void */ ; p > xff; p--) {
        if (*p == ' ' || *p == ',') {
            p++;
            break;
        }
    }

    if (ngx_parse_addr_port(r->pool, &paddr, p, xfflen - (p - xff)) != NGX_OK) {
        return NGX_DECLINED;
    }

    *addr = paddr;

    if (recursive && p > xff) {
        rc = ngx_http_get_forwarded_addr_internal(r, addr, xff, p - 1 - xff,
                                                  proxies, 1);

        if (rc == NGX_DECLINED) {
            return NGX_DONE;
        }

        /* rc == NGX_OK || rc == NGX_DONE  */
        return rc;
    }

    return NGX_OK;
}